

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QWidget*,QPersistentModelIndex>::emplace_helper<QPersistentModelIndex_const&>
          (QHash<QWidget*,QPersistentModelIndex> *this,QWidget **key,QPersistentModelIndex *args)

{
  byte bVar1;
  Entry *pEVar2;
  QPersistentModelIndexData *pQVar3;
  piter pVar4;
  long in_FS_OFFSET;
  QPersistentModelIndex local_50;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QWidget*,QPersistentModelIndex>>::findOrInsert<QWidget*>
            ((InsertionResult *)local_48,
             *(Data<QHashPrivate::Node<QWidget*,QPersistentModelIndex>> **)this,key);
  pEVar2 = (*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
          [(uint)local_48._8_8_ & 0x7f];
  if (local_48[0x10] == false) {
    *(QWidget **)pEVar2[bVar1].storage.data = *key;
    QPersistentModelIndex::QPersistentModelIndex
              ((QPersistentModelIndex *)(pEVar2[bVar1].storage.data + 8),args);
  }
  else {
    QPersistentModelIndex::QPersistentModelIndex(&local_50,args);
    pQVar3 = *(QPersistentModelIndexData **)(pEVar2[bVar1].storage.data + 8);
    *(QPersistentModelIndexData **)(pEVar2[bVar1].storage.data + 8) = local_50.d;
    local_50.d = pQVar3;
    QPersistentModelIndex::~QPersistentModelIndex(&local_50);
  }
  pVar4.bucket = local_48._8_8_;
  pVar4.d = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)local_48._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (iterator)pVar4;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }